

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

bool __thiscall GrcSymbolTableEntry::IsMovement(GrcSymbolTableEntry *this)

{
  bool bVar1;
  Symbol this_00;
  GrcSymbolTableEntry *in_RDI;
  Symbol psymParent;
  char *in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  bVar1 = std::operator==(&in_RDI->m_staFieldName,in_stack_ffffffffffffffd8);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = std::operator==(&in_RDI->m_staFieldName,in_stack_ffffffffffffffd8);
    if (bVar1) {
      local_1 = true;
    }
    else {
      bVar1 = std::operator==(&in_RDI->m_staFieldName,in_stack_ffffffffffffffd8);
      if (bVar1) {
        local_1 = true;
      }
      else {
        this_00 = ParentSymbol(in_RDI);
        if (this_00 == (Symbol)0x0) {
          local_1 = false;
        }
        else {
          local_1 = IsMovement(this_00);
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool GrcSymbolTableEntry::IsMovement()
{
	if (m_staFieldName == "shift")
		return true;
	if (m_staFieldName == "kern")
		return true;
	if (m_staFieldName == "advance")
		return true;
	Symbol psymParent = ParentSymbol();
	if (!psymParent)
		return false;
	return (psymParent->IsMovement());
}